

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

Arch Catch::Detail::anon_unknown_0::Endianness::which(void)

{
  _ u;
  
  return Little;
}

Assistant:

static Arch which() {
                union _{
                    int asInt;
                    char asChar[sizeof (int)];
                } u;

                u.asInt = 1;
                return ( u.asChar[sizeof(int)-1] == 1 ) ? Big : Little;
            }